

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentAtomicCounterCase::iterate
          (ConcurrentAtomicCounterCase *this)

{
  pointer *__return_storage_ptr__;
  glGetUniformLocationFunc p_Var1;
  glUseProgramFunc p_Var2;
  int iVar3;
  deUint32 dVar4;
  GLenum err;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  reference pvVar9;
  MessageBuilder local_ce0;
  int local_b5c;
  MessageBuilder local_b58;
  int local_9d4;
  undefined1 local_9d0 [4];
  int logCallNdx;
  value_type local_84c;
  iterator iStack_848;
  int valueNdx;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_840;
  MessageBuilder local_838;
  undefined1 local_6b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> intermediateResults;
  int local_51c;
  MessageBuilder local_518;
  int local_394;
  MessageBuilder local_390;
  deUint32 local_20c;
  GLuint local_208;
  deUint32 result;
  int callNdx;
  undefined1 local_1da;
  allocator<char> local_1d9;
  string local_1d8;
  MessageBuilder local_1a8;
  GLint local_28;
  GLint local_24;
  int oddCallNdxLocation;
  int evenCallNdxLocation;
  Functions *gl;
  ConcurrentAtomicCounterCase *this_local;
  
  gl = (Functions *)this;
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  _oddCallNdxLocation = (Functions *)CONCAT44(extraout_var,iVar3);
  p_Var1 = _oddCallNdxLocation->getUniformLocation;
  dVar4 = glu::ShaderProgram::getProgram(this->m_evenProgram);
  local_24 = (*p_Var1)(dVar4,"u_callNdx");
  p_Var1 = _oddCallNdxLocation->getUniformLocation;
  dVar4 = glu::ShaderProgram::getProgram(this->m_oddProgram);
  local_28 = (*p_Var1)(dVar4,"u_callNdx");
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_1a8,(char (*) [34])"Running shader pair (even & odd) ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_numCalls);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x2bf2e78);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [15])"Num groups = (");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_workSize);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])", 1, 1)\n");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  if (local_24 == -1) {
    local_1da = 1;
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"u_callNdx location was -1",&local_1d9);
    tcu::TestError::TestError(pTVar8,&local_1d8);
    local_1da = 0;
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (local_28 == -1) {
    result._2_1_ = 1;
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&callNdx,"u_callNdx location was -1",(allocator<char> *)((long)&result + 3)
              );
    tcu::TestError::TestError(pTVar8,(string *)&callNdx);
    result._2_1_ = 0;
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*_oddCallNdxLocation->bindBufferBase)(0x90d2,1,this->m_intermediateResultBuffer);
  (*_oddCallNdxLocation->bindBufferBase)(0x92c0,2,this->m_counterBuffer);
  for (local_208 = 0; (int)local_208 < this->m_numCalls; local_208 = local_208 + 1) {
    p_Var2 = _oddCallNdxLocation->useProgram;
    dVar4 = glu::ShaderProgram::getProgram(this->m_evenProgram);
    (*p_Var2)(dVar4);
    (*_oddCallNdxLocation->uniform1ui)(local_24,local_208);
    (*_oddCallNdxLocation->dispatchCompute)(this->m_workSize,1,1);
    p_Var2 = _oddCallNdxLocation->useProgram;
    dVar4 = glu::ShaderProgram::getProgram(this->m_oddProgram);
    (*p_Var2)(dVar4);
    (*_oddCallNdxLocation->uniform1ui)(local_28,local_208);
    (*_oddCallNdxLocation->dispatchCompute)(this->m_workSize,1,1);
  }
  err = (*_oddCallNdxLocation->getError)();
  glu::checkError(err,"post dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x9c7);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_390,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_390,(char (*) [37])"Verifying work buffer, it should be ");
  local_394 = this->m_numCalls * this->m_workSize;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_394);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_390);
  (*_oddCallNdxLocation->bindBuffer)(0x92c0,this->m_counterBuffer);
  local_20c = readBufferUint32(_oddCallNdxLocation,0x92c0);
  if (local_20c == this->m_numCalls * this->m_workSize) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    __return_storage_ptr__ =
         &intermediateResults.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
    tcu::TestLog::operator<<
              ((MessageBuilder *)__return_storage_ptr__,pTVar6,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)__return_storage_ptr__,
                        (char (*) [25])"Counter buffer is valid.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder
              ((MessageBuilder *)
               &intermediateResults.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6b8);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_838,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_838,(char (*) [33])"Verifying intermediate results. ");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_838);
    (*_oddCallNdxLocation->bindBuffer)(0x90d2,this->m_intermediateResultBuffer);
    readBuffer(_oddCallNdxLocation,0x90d2,this->m_numCalls * this->m_workSize,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6b8);
    local_840._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6b8);
    iStack_848 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6b8);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (local_840,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iStack_848._M_current);
    local_84c = 0;
LAB_02170f39:
    if ((int)local_84c < this->m_workSize * this->m_numCalls) {
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6b8,
                          (long)(int)local_84c);
      if (*pvVar9 == local_84c) goto LAB_02171289;
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_9d0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_9d0,
                          (char (*) [43])"Intermediate buffer error, at value index ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_84c);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])0x2c16365);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&local_84c);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x2c59494);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6b8,
                          (long)(int)local_84c);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pvVar9);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2c7b265);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [68])
                                 "Intermediate buffer contains invalid values. Intermediate results:\n"
                         );
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_9d0);
      for (local_9d4 = 0; local_9d4 < this->m_workSize * this->m_numCalls; local_9d4 = local_9d4 + 1
          ) {
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_b58,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_b58,(char (*) [7])"Value[");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_9d4);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [5])0x2bbcf58);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6b8,
                            (long)local_9d4);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pvVar9);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_b58);
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Buffer contents invalid");
      this_local._4_4_ = STOP;
      local_b5c = 1;
    }
    else {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_ce0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_ce0,(char (*) [32])"Intermediate buffers are valid.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_ce0);
      local_b5c = 0;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6b8);
    if (local_b5c == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      this_local._4_4_ = STOP;
    }
  }
  else {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_518,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_518,(char (*) [38])"Counter buffer error, expected value ");
    local_51c = this->m_numCalls * this->m_workSize;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_51c);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [7])0x2c59494);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_20c);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b8f97b);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_518);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Buffer contents invalid");
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
LAB_02171289:
  local_84c = local_84c + 1;
  goto LAB_02170f39;
}

Assistant:

TestCase::IterateResult ConcurrentAtomicCounterCase::iterate (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// invoke program N times, each with a different delta
	{
		const int evenCallNdxLocation	= gl.getUniformLocation(m_evenProgram->getProgram(), "u_callNdx");
		const int oddCallNdxLocation	= gl.getUniformLocation(m_oddProgram->getProgram(), "u_callNdx");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Running shader pair (even & odd) " << m_numCalls << " times.\n"
			<< "Num groups = (" << m_workSize << ", 1, 1)\n"
			<< tcu::TestLog::EndMessage;

		if (evenCallNdxLocation == -1)
			throw tcu::TestError("u_callNdx location was -1");
		if (oddCallNdxLocation == -1)
			throw tcu::TestError("u_callNdx location was -1");

		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_intermediateResultBuffer);
		gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 2, m_counterBuffer);

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			gl.useProgram(m_evenProgram->getProgram());
			gl.uniform1ui(evenCallNdxLocation, (deUint32)callNdx);
			gl.dispatchCompute(m_workSize, 1, 1);

			gl.useProgram(m_oddProgram->getProgram());
			gl.uniform1ui(oddCallNdxLocation, (deUint32)callNdx);
			gl.dispatchCompute(m_workSize, 1, 1);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "post dispatch");
	}

	// Verify result
	{
		deUint32 result;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying work buffer, it should be " << m_numCalls*m_workSize << tcu::TestLog::EndMessage;

		gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counterBuffer);
		result = readBufferUint32(gl, GL_ATOMIC_COUNTER_BUFFER);

		if ((int)result != m_numCalls*m_workSize)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Counter buffer error, expected value " << (m_numCalls*m_workSize) << ", got " << result << "\n"
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
			return STOP;
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Counter buffer is valid." << tcu::TestLog::EndMessage;
	}

	// verify steps
	{
		std::vector<deUint32> intermediateResults;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying intermediate results. " << tcu::TestLog::EndMessage;

		// collect results

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_intermediateResultBuffer);
		readBuffer(gl, GL_SHADER_STORAGE_BUFFER, m_numCalls * m_workSize, intermediateResults);

		// verify values

		std::sort(intermediateResults.begin(), intermediateResults.end());

		for (int valueNdx = 0; valueNdx < m_workSize * m_numCalls; ++valueNdx)
		{
			if ((int)intermediateResults[valueNdx] != valueNdx)
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Intermediate buffer error, at value index " << valueNdx << ", expected " << valueNdx << ", got " << intermediateResults[valueNdx] << ".\n"
					<< "Intermediate buffer contains invalid values. Intermediate results:\n"
					<< tcu::TestLog::EndMessage;

				for (int logCallNdx = 0; logCallNdx < m_workSize * m_numCalls; ++logCallNdx)
					m_testCtx.getLog() << tcu::TestLog::Message << "Value[" << logCallNdx << "] = " << intermediateResults[logCallNdx] << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Intermediate buffers are valid." << tcu::TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}